

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype __thiscall QtPrivate::count(QtPrivate *this,QStringView haystack,QRegularExpression *re)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  QRegularExpression *this_00;
  long in_FS_OFFSET;
  QStringView subjectView;
  long local_58;
  QRegularExpressionMatch match;
  
  this_00 = (QRegularExpression *)haystack.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QRegularExpression::isValid(this_00);
  if (bVar2) {
    lVar3 = -1;
    local_58 = 0;
    do {
      if ((long)this <= lVar3) break;
      match.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      subjectView.m_data = (storage_type_conflict *)this;
      subjectView.m_size = (qsizetype)this_00;
      QRegularExpression::matchView
                ((QRegularExpression *)&match,subjectView,haystack.m_size,
                 (int)lVar3 + PartialPreferCompleteMatch,(MatchOptions)0x0);
      bVar2 = QRegularExpressionMatch::hasMatch(&match);
      if (bVar2) {
        lVar3 = QRegularExpressionMatch::capturedStart(&match,0);
        local_58 = local_58 + 1;
        if (lVar3 < (long)this) {
          lVar3 = lVar3 + (ulong)((*(ushort *)(haystack.m_size + lVar3 * 2) & 0xfc00) == 0xd800);
        }
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(&match);
    } while (bVar2);
  }
  else {
    QRegularExpression::pattern((QString *)&match,this_00);
    qtWarnAboutInvalidRegularExpression((QString *)&match,"QString(View)::count");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
    local_58 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, const QRegularExpression &re)
{
    if (!re.isValid()) {
        qtWarnAboutInvalidRegularExpression(re.pattern(), "QString(View)::count");
        return 0;
    }
    qsizetype count = 0;
    qsizetype index = -1;
    qsizetype len = haystack.size();
    while (index <= len - 1) {
        QRegularExpressionMatch match = re.matchView(haystack, index + 1);
        if (!match.hasMatch())
            break;
        count++;

        // Search again, from the next character after the beginning of this
        // capture. If the capture starts with a surrogate pair, both together
        // count as "one character".
        index = match.capturedStart();
        if (index < len && haystack[index].isHighSurrogate())
            ++index;
    }
    return count;
}